

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_soc_v2(opj_j2k_v2_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  undefined8 uVar1;
  OPJ_SIZE_T OVar2;
  OPJ_OFF_T OVar3;
  opj_event_mgr_t *in_RDX;
  opj_stream_private_t *in_RSI;
  opj_codestream_index_t *in_RDI;
  OPJ_UINT32 l_marker;
  OPJ_BYTE l_data [2];
  OPJ_UINT32 local_28;
  OPJ_UINT32 in_stack_ffffffffffffffdc;
  OPJ_UINT32 type;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  opj_bool oVar4;
  
  OVar2 = opj_stream_read_data
                    ((opj_stream_private_t *)
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (OPJ_BYTE *)in_RDI,(OPJ_SIZE_T)((ulong)in_RSI >> 0x20),in_RDX);
  if (OVar2 == 2) {
    opj_read_bytes_LE(&stack0xffffffffffffffde,&local_28,2);
    if (local_28 == 0xff4f) {
      *(undefined4 *)&in_RDI->main_head_end = 2;
      OVar3 = opj_stream_tell(in_RSI);
      type = (OPJ_UINT32)((ulong)in_RSI >> 0x20);
      *(OPJ_OFF_T *)in_RDI[4].tile_index = OVar3 + -2;
      uVar1._0_4_ = (in_RDI[4].tile_index)->tileno;
      uVar1._4_4_ = (in_RDI[4].tile_index)->nb_tps;
      opj_event_msg_v2(in_RDX,4,"Start to read j2k main header (%d).\n",uVar1);
      j2k_add_mhmarker_v2(in_RDI,type,(OPJ_OFF_T)in_RDX,in_stack_ffffffffffffffdc);
      oVar4 = 1;
    }
    else {
      oVar4 = 0;
    }
  }
  else {
    oVar4 = 0;
  }
  return oVar4;
}

Assistant:

static opj_bool j2k_read_soc_v2(	opj_j2k_v2_t *p_j2k,
									struct opj_stream_private *p_stream,
									struct opj_event_mgr * p_manager )
{
	OPJ_BYTE l_data [2];
	OPJ_UINT32 l_marker;

	/* preconditions */
	assert(p_j2k != 00);
	assert(p_manager != 00);
	assert(p_stream != 00);

	if (opj_stream_read_data(p_stream,l_data,2,p_manager) != 2) {
		return OPJ_FALSE;
	}

	opj_read_bytes(l_data,&l_marker,2);
	if (l_marker != J2K_MS_SOC) {
		return OPJ_FALSE;
	}

	/* Next marker should be a SIZ marker in the main header */
	p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_MHSIZ;

	/* FIXME move it in a index structure included in p_j2k*/
	p_j2k->cstr_index->main_head_start = opj_stream_tell(p_stream) - 2;

	opj_event_msg_v2(p_manager, EVT_INFO, "Start to read j2k main header (%d).\n", p_j2k->cstr_index->main_head_start);

	/* Add the marker to the codestream index*/
	j2k_add_mhmarker_v2(p_j2k->cstr_index, J2K_MS_SOC, p_j2k->cstr_index->main_head_start, 2);

	return OPJ_TRUE;
}